

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QByteArray,_QTzTimeZone> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_>::findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this,QByteArray *key)

{
  ulong uVar1;
  Node<QByteArray,_QTzTimeZone> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QByteArray>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QByteArray,_QTzTimeZone> *)0x0;
  }
  else {
    pNVar2 = (Node<QByteArray,_QTzTimeZone> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }